

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.cpp
# Opt level: O3

void util::binary_string::load(istream *is,string *target)

{
  uint uVar1;
  uint uVar2;
  char buffer [4];
  uint local_2838 [2562];
  
  std::istream::read((char *)is,(long)local_2838);
  if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) {
    target->_M_string_length = 0;
    *(target->_M_dataplus)._M_p = '\0';
    for (uVar1 = local_2838[0]; uVar1 != 0; uVar1 = uVar1 - uVar2) {
      uVar2 = 0x2800;
      if (uVar1 < 0x2800) {
        uVar2 = uVar1;
      }
      std::istream::read((char *)is,(long)local_2838);
      std::__cxx11::string::append((char *)target,(ulong)local_2838);
    }
  }
  return;
}

Assistant:

void binary_string::load(std::istream & is, std::string & target) {
	
	boost::uint32_t length = util::load<boost::uint32_t>(is);
	if(is.fail()) {
		return;
	}
	
	target.clear();
	
	while(length) {
		char buffer[10 * 1024];
		boost::uint32_t buf_size = std::min(length, boost::uint32_t(sizeof(buffer)));
		is.read(buffer, std::streamsize(buf_size));
		target.append(buffer, buf_size);
		length -= buf_size;
	}
}